

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O3

int32_t ures_swap_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                    UErrorCode *pErrorCode)

{
  byte bVar1;
  int32_t iVar2;
  uint32_t res;
  uint uVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  uint uVar7;
  uint32_t *__s;
  Resource *outBundle;
  char *fmt;
  byte bVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  Resource *inBundle;
  uint local_d28;
  TempTable local_ce0;
  uint32_t stackResFlags [200];
  int32_t resort [200];
  Row rows [200];
  
  iVar2 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  bVar8 = *(byte *)((long)inData + 0xd);
  if (((bVar8 != 0x65 || *(byte *)((long)inData + 0xc) != 0x52) ||
      (bVar8 = 0x65, *(char *)((long)inData + 0xe) != 's')) ||
     (*(char *)((long)inData + 0xf) != 'B')) {
LAB_001b073a:
    udata_printError_63(ds,
                        "ures_swap(): data format %02x.%02x.%02x.%02x (format version %02x.%02x) is not a resource bundle\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),(ulong)bVar8,
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        (ulong)*(byte *)((long)inData + 0x10),(ulong)*(byte *)((long)inData + 0x11))
    ;
    *pErrorCode = U_UNSUPPORTED_ERROR;
    return 0;
  }
  bVar1 = *(byte *)((long)inData + 0x10);
  if (bVar1 == 1) {
    if (*(char *)((long)inData + 0x11) == '\0') goto LAB_001b073a;
  }
  else if ((bVar1 & 0xfe) != 2) goto LAB_001b073a;
  local_ce0.majorFormatVersion = bVar1;
  if (length < 0) {
    local_d28 = 0xffffffff;
  }
  else {
    if (length - iVar2 < 0x18) {
      udata_printError_63(ds,"ures_swap(): too few bytes (%d after header) for a resource bundle\n")
      ;
      goto LAB_001b0861;
    }
    local_d28 = (uint)(length - iVar2) >> 2;
  }
  lVar11 = (long)iVar2;
  res = (*ds->readUInt32)(*(uint32_t *)((long)inData + lVar11));
  uVar3 = udata_readInt32_63(ds,*(int32_t *)((long)inData + lVar11 + 4));
  uVar3 = uVar3 & 0xff;
  if (uVar3 < 5) {
    udata_printError_63(ds,"ures_swap(): too few indexes for a 1.1+ resource bundle\n");
  }
  else {
    inBundle = (Resource *)(lVar11 + (long)inData);
    iVar4 = udata_readInt32_63(ds,inBundle[2]);
    iVar5 = iVar4;
    if (6 < uVar3) {
      iVar5 = udata_readInt32_63(ds,inBundle[7]);
    }
    iVar6 = udata_readInt32_63(ds,inBundle[4]);
    uVar7 = udata_readInt32_63(ds,inBundle[5]);
    if (((int)local_d28 < 0) || (iVar6 <= (int)local_d28)) {
      iVar9 = uVar3 + 1;
      local_ce0.localKeyLimit = 0;
      if (iVar4 - iVar9 != 0 && iVar9 <= iVar4) {
        local_ce0.localKeyLimit = iVar4 * 4;
      }
      if (length < 0) {
LAB_001b0abf:
        return iVar2 + iVar6 * 4;
      }
      uVar3 = (length + 0x1fU >> 5) + 3 & 0x7fffffc;
      if (uVar3 < 0x321) {
        __s = stackResFlags;
      }
      else {
        __s = (uint32_t *)uprv_malloc_63((ulong)uVar3);
        if (__s == (uint32_t *)0x0) {
          local_ce0.resFlags = __s;
          udata_printError_63(ds,"ures_swap(): unable to allocate memory for tracking resources\n");
          *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
          return 0;
        }
      }
      outBundle = (Resource *)(lVar11 + (long)outData);
      local_ce0.resFlags = __s;
      memset(__s,0,(ulong)uVar3);
      if (inData != outData) {
        memcpy(outBundle,inBundle,(long)(iVar6 * 4));
      }
      uVar10 = iVar9 * 4;
      uVar3 = (iVar4 - iVar9) * 4;
      udata_swapInvStringBlock_63
                (ds,(void *)((ulong)uVar10 + (long)inBundle),uVar3,
                 (void *)((long)outBundle + (ulong)uVar10),pErrorCode);
      if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar9 = iVar5 - iVar4;
        if ((iVar9 == 0 || iVar5 < iVar4) ||
           ((*ds->swapArray16)(ds,inBundle + iVar4,iVar9 * 4,outBundle + iVar4,pErrorCode),
           *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
          local_ce0.keyChars = (char *)outBundle;
          if ((bVar1 < 2) && (200 < (int)uVar7)) {
            local_ce0.rows = (Row *)uprv_malloc_63((ulong)(uVar7 * 4) + (ulong)uVar7 * 8);
            if (local_ce0.rows == (Row *)0x0) {
              udata_printError_63(ds,
                                  "ures_swap(): unable to allocate memory for sorting tables (max length: %d)\n"
                                  ,uVar7);
              *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
              if (__s == stackResFlags) {
                return 0;
              }
              uprv_free_63(__s);
              return 0;
            }
            local_ce0.resort = &local_ce0.rows[uVar7].keyIndex;
          }
          else {
            local_ce0.rows = rows;
            local_ce0.resort = resort;
          }
          ures_swapResource(ds,inBundle,outBundle,res,(char *)0x0,&local_ce0,pErrorCode);
          if (U_ZERO_ERROR < *pErrorCode) {
            udata_printError_63(ds,"ures_swapResource(root res=%08x) failed\n",(ulong)res);
          }
          if (local_ce0.rows != rows) {
            uprv_free_63(local_ce0.rows);
          }
          if (local_ce0.resFlags != stackResFlags) {
            uprv_free_63(local_ce0.resFlags);
          }
          (*ds->swapArray32)(ds,inBundle,uVar10,outBundle,pErrorCode);
          goto LAB_001b0abf;
        }
        uVar3 = iVar9 * 2;
        fmt = "ures_swap().swapArray16(16-bit units[%d]) failed\n";
      }
      else {
        fmt = "ures_swap().udata_swapInvStringBlock(keys[%d]) failed\n";
      }
      udata_printError_63(ds,fmt,(ulong)uVar3);
      return 0;
    }
    udata_printError_63(ds,"ures_swap(): resource top %d exceeds bundle length %d\n");
  }
LAB_001b0861:
  *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ures_swap(const UDataSwapper *ds,
          const void *inData, int32_t length, void *outData,
          UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    const Resource *inBundle;
    Resource rootRes;
    int32_t headerSize, maxTableLength;

    Row rows[STACK_ROW_CAPACITY];
    int32_t resort[STACK_ROW_CAPACITY];
    TempTable tempTable;

    const int32_t *inIndexes;

    /* the following integers count Resource item offsets (4 bytes each), not bytes */
    int32_t bundleLength, indexLength, keysBottom, keysTop, resBottom, top;

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x52 &&   /* dataFormat="ResB" */
        pInfo->dataFormat[1]==0x65 &&
        pInfo->dataFormat[2]==0x73 &&
        pInfo->dataFormat[3]==0x42 &&
        /* formatVersion 1.1+ or 2.x or 3.x */
        ((pInfo->formatVersion[0]==1 && pInfo->formatVersion[1]>=1) ||
            pInfo->formatVersion[0]==2 || pInfo->formatVersion[0]==3)
    )) {
        udata_printError(ds, "ures_swap(): data format %02x.%02x.%02x.%02x (format version %02x.%02x) is not a resource bundle\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0], pInfo->formatVersion[1]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }
    tempTable.majorFormatVersion=pInfo->formatVersion[0];

    /* a resource bundle must contain at least one resource item */
    if(length<0) {
        bundleLength=-1;
    } else {
        bundleLength=(length-headerSize)/4;

        /* formatVersion 1.1 must have a root item and at least 5 indexes */
        if(bundleLength<(1+5)) {
            udata_printError(ds, "ures_swap(): too few bytes (%d after header) for a resource bundle\n",
                             length-headerSize);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
    }

    inBundle=(const Resource *)((const char *)inData+headerSize);
    rootRes=ds->readUInt32(*inBundle);

    /* formatVersion 1.1 adds the indexes[] array */
    inIndexes=(const int32_t *)(inBundle+1);

    indexLength=udata_readInt32(ds, inIndexes[URES_INDEX_LENGTH])&0xff;
    if(indexLength<=URES_INDEX_MAX_TABLE_LENGTH) {
        udata_printError(ds, "ures_swap(): too few indexes for a 1.1+ resource bundle\n");
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }
    keysBottom=1+indexLength;
    keysTop=udata_readInt32(ds, inIndexes[URES_INDEX_KEYS_TOP]);
    if(indexLength>URES_INDEX_16BIT_TOP) {
        resBottom=udata_readInt32(ds, inIndexes[URES_INDEX_16BIT_TOP]);
    } else {
        resBottom=keysTop;
    }
    top=udata_readInt32(ds, inIndexes[URES_INDEX_BUNDLE_TOP]);
    maxTableLength=udata_readInt32(ds, inIndexes[URES_INDEX_MAX_TABLE_LENGTH]);

    if(0<=bundleLength && bundleLength<top) {
        udata_printError(ds, "ures_swap(): resource top %d exceeds bundle length %d\n",
                         top, bundleLength);
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }
    if(keysTop>(1+indexLength)) {
        tempTable.localKeyLimit=keysTop<<2;
    } else {
        tempTable.localKeyLimit=0;
    }

    if(length>=0) {
        Resource *outBundle=(Resource *)((char *)outData+headerSize);

        /* track which resources we have already swapped */
        uint32_t stackResFlags[STACK_ROW_CAPACITY];
        int32_t resFlagsLength;

        /*
         * We need one bit per 4 resource bundle bytes so that we can track
         * every possible Resource for whether we have swapped it already.
         * Multiple Resource words can refer to the same bundle offsets
         * for sharing identical values.
         * We could optimize this by allocating only for locations above
         * where Resource values are stored (above keys & strings).
         */
        resFlagsLength=(length+31)>>5;          /* number of bytes needed */
        resFlagsLength=(resFlagsLength+3)&~3;   /* multiple of 4 bytes for uint32_t */
        if(resFlagsLength<=(int32_t)sizeof(stackResFlags)) {
            tempTable.resFlags=stackResFlags;
        } else {
            tempTable.resFlags=(uint32_t *)uprv_malloc(resFlagsLength);
            if(tempTable.resFlags==NULL) {
                udata_printError(ds, "ures_swap(): unable to allocate memory for tracking resources\n");
                *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
                return 0;
            }
        }
        uprv_memset(tempTable.resFlags, 0, resFlagsLength);

        /* copy the bundle for binary and inaccessible data */
        if(inData!=outData) {
            uprv_memcpy(outBundle, inBundle, 4*top);
        }

        /* swap the key strings, but not the padding bytes (0xaa) after the last string and its NUL */
        udata_swapInvStringBlock(ds, inBundle+keysBottom, 4*(keysTop-keysBottom),
                                    outBundle+keysBottom, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            udata_printError(ds, "ures_swap().udata_swapInvStringBlock(keys[%d]) failed\n", 4*(keysTop-keysBottom));
            return 0;
        }

        /* swap the 16-bit units (strings, table16, array16) */
        if(keysTop<resBottom) {
            ds->swapArray16(ds, inBundle+keysTop, (resBottom-keysTop)*4, outBundle+keysTop, pErrorCode);
            if(U_FAILURE(*pErrorCode)) {
                udata_printError(ds, "ures_swap().swapArray16(16-bit units[%d]) failed\n", 2*(resBottom-keysTop));
                return 0;
            }
        }

        /* allocate the temporary table for sorting resource tables */
        tempTable.keyChars=(const char *)outBundle; /* sort by outCharset */
        if(tempTable.majorFormatVersion>1 || maxTableLength<=STACK_ROW_CAPACITY) {
            tempTable.rows=rows;
            tempTable.resort=resort;
        } else {
            tempTable.rows=(Row *)uprv_malloc(maxTableLength*sizeof(Row)+maxTableLength*4);
            if(tempTable.rows==NULL) {
                udata_printError(ds, "ures_swap(): unable to allocate memory for sorting tables (max length: %d)\n",
                                 maxTableLength);
                *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
                if(tempTable.resFlags!=stackResFlags) {
                    uprv_free(tempTable.resFlags);
                }
                return 0;
            }
            tempTable.resort=(int32_t *)(tempTable.rows+maxTableLength);
        }

        /* swap the resources */
        ures_swapResource(ds, inBundle, outBundle, rootRes, NULL, &tempTable, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            udata_printError(ds, "ures_swapResource(root res=%08x) failed\n",
                             rootRes);
        }

        if(tempTable.rows!=rows) {
            uprv_free(tempTable.rows);
        }
        if(tempTable.resFlags!=stackResFlags) {
            uprv_free(tempTable.resFlags);
        }

        /* swap the root resource and indexes */
        ds->swapArray32(ds, inBundle, keysBottom*4, outBundle, pErrorCode);
    }

    return headerSize+4*top;
}